

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O1

void njoy::tools::disco::Integer<5u>::write<int,std::back_insert_iterator<std::__cxx11::string>>
               (int *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  int iVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  ostringstream buffer;
  undefined1 auStack_1c8 [8];
  char local_1c0;
  undefined7 uStack_1bf;
  long local_1b8;
  long local_1b0 [2];
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  iVar1 = *value;
  iVar3 = -iVar1;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  iVar3 = Integer<5U>::minimumRequiredWidth<int>(iVar3);
  iVar1 = *value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 5;
  if ((uint)(iVar3 - (iVar1 >> 0x1f)) < 6) {
    std::ostream::operator<<(local_1a0,*value);
  }
  else {
    lVar4 = *(long *)(local_1a0[0] + -0x18);
    if (acStack_c0[lVar4 + 1] == '\0') {
      cVar2 = std::ios::widen((char)auStack_1c8 + (char)lVar4 + '(');
      acStack_c0[lVar4] = cVar2;
      acStack_c0[lVar4 + 1] = '\x01';
    }
    acStack_c0[lVar4] = '*';
    local_1c0 = '*';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1c0,1);
  }
  std::__cxx11::stringbuf::str();
  if (local_1b8 != 0) {
    lVar4 = 0;
    do {
      std::__cxx11::string::push_back((char)iter->container);
      lVar4 = lVar4 + 1;
    } while (local_1b8 != lVar4);
  }
  if ((long *)CONCAT71(uStack_1bf,local_1c0) != local_1b0) {
    operator_delete((long *)CONCAT71(uStack_1bf,local_1c0),local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    // std::abs does not exist for all integer types (e.g. unsigned)
    const Representation absValue = value < 0 ? -value : value;
    const auto required = minimumRequiredWidth( absValue )
                        + ( value < 0 ? 1 : 0 );

    std::ostringstream buffer;
    buffer << std::right << std::setw( Width );
    if ( required > Width ) {

      buffer << std::setfill( '*' ) << '*';
    }
    else {

      buffer << value;
    }

    for ( auto b : buffer.str() ) {

      *iter++ = b;
    }
  }